

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

bool __thiscall basisu::basisu_frontend::init_global_codebooks(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  undefined8 *puVar1;
  uint8_t uVar2;
  byte bVar3;
  endpoint_cluster_etc_params *peVar4;
  void *pvVar5;
  endpoint *peVar6;
  etc_block *peVar7;
  job_pool *this_01;
  byte bVar8;
  byte bVar9;
  long lVar10;
  uint32_t uVar11;
  byte bVar12;
  undefined4 uVar13;
  _Any_data *p_Var14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  char cVar18;
  uint uVar19;
  elemental_vector *this_02;
  byte bVar20;
  uint32_t new_size_1;
  int iVar21;
  byte bVar22;
  uint uVar23;
  uint32_t new_size_5;
  vector<unsigned_int> *pvVar24;
  long lVar25;
  basisu_lowlevel_etc1s_transcoder *pbVar26;
  ulong uVar27;
  uint32_t new_size;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  cluster_subblock_etc_params_vec *local_70;
  elemental_vector *local_68;
  uint32_t local_5c;
  elemental_vector *local_58;
  basisu_frontend *local_50;
  basisu_lowlevel_etc1s_transcoder *local_48;
  elemental_vector *local_40;
  long local_38;
  
  local_48 = (this->m_params).m_pGlobal_codebooks;
  local_70 = &this->m_endpoint_cluster_etc_params;
  uVar23 = (local_48->m_local_endpoints).m_size;
  uVar19 = (this->m_endpoint_cluster_etc_params).m_size;
  uVar15 = uVar19 - uVar23;
  if (uVar15 != 0) {
    if (uVar19 < uVar23 || uVar15 == 0) {
      if ((this->m_endpoint_cluster_etc_params).m_capacity < uVar23) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_70,uVar23,uVar19 + 1 == uVar23,0x38,
                   vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::object_mover,false)
        ;
        uVar19 = (this->m_endpoint_cluster_etc_params).m_size;
      }
      if (uVar23 - uVar19 != 0) {
        peVar4 = local_70->m_p;
        lVar25 = 0;
        do {
          puVar1 = (undefined8 *)((long)peVar4[uVar19].m_color_error + lVar25 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)peVar4[uVar19].m_color_error + lVar25);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&peVar4[uVar19].m_color_unscaled[0].field_0 + lVar25);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)(peVar4[uVar19].m_color_used + lVar25 + -1) = 0;
          lVar25 = lVar25 + 0x38;
        } while ((ulong)(uVar23 - uVar19) * 0x38 - lVar25 != 0);
      }
    }
    else {
      peVar4 = local_70->m_p;
      lVar25 = 0;
      do {
        pvVar5 = *(void **)((long)peVar4[uVar23].m_color_error + lVar25 + 0x10);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar25 = lVar25 + 0x38;
      } while ((ulong)uVar15 * 0x38 - lVar25 != 0);
    }
    (this->m_endpoint_cluster_etc_params).m_size = uVar23;
    uVar23 = (local_48->m_local_endpoints).m_size;
  }
  pbVar26 = local_48;
  if (uVar23 != 0) {
    lVar25 = 0;
    uVar16 = 0;
    do {
      if ((this->m_endpoint_cluster_etc_params).m_size <= uVar16) goto LAB_002296d5;
      *(uint *)((long)local_70->m_p->m_inten_table + lVar25) =
           (uint)(local_48->m_local_endpoints).m_p[uVar16].m_inten5;
      if ((local_48->m_local_endpoints).m_size <= uVar16) {
LAB_00229775:
        pcVar17 = 
        "const T &basisu::vector<basist::endpoint>::operator[](size_t) const [T = basist::endpoint]"
        ;
LAB_002296ac:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,pcVar17);
      }
      if (((this->m_endpoint_cluster_etc_params).m_size <= uVar16) ||
         (*(uint *)((long)((this->m_endpoint_cluster_etc_params).m_p)->m_inten_table + lVar25 + 4) =
               (uint)(local_48->m_local_endpoints).m_p[uVar16].m_inten5,
         (this->m_endpoint_cluster_etc_params).m_size <= uVar16)) goto LAB_002296d5;
      if ((local_48->m_local_endpoints).m_size <= uVar16) goto LAB_00229775;
      peVar4 = (this->m_endpoint_cluster_etc_params).m_p;
      peVar6 = (local_48->m_local_endpoints).m_p;
      uVar2 = peVar6[uVar16].m_color5.field_0.field_0.b;
      *(undefined2 *)((long)&peVar4->m_color_unscaled[0].field_0 + lVar25) =
           *(undefined2 *)&peVar6[uVar16].m_color5.field_0;
      peVar4->m_color_unscaled[0].field_0.m_comps[lVar25 + 2] = uVar2;
      peVar4->m_color_unscaled[0].field_0.m_comps[lVar25 + 3] = 0xff;
      if (((this->m_endpoint_cluster_etc_params).m_size <= uVar16) ||
         (((this->m_endpoint_cluster_etc_params).m_p)->m_color_used[lVar25] = true,
         (this->m_endpoint_cluster_etc_params).m_size <= uVar16)) goto LAB_002296d5;
      local_70->m_p->m_color_used[lVar25 + 2] = true;
      uVar16 = uVar16 + 1;
      lVar25 = lVar25 + 0x38;
    } while (uVar16 < (local_48->m_local_endpoints).m_size);
  }
  uVar23 = (local_48->m_local_selectors).m_size;
  uVar19 = (this->m_optimized_cluster_selectors).m_size;
  if (uVar19 != uVar23) {
    if ((uVar19 <= uVar23) && ((this->m_optimized_cluster_selectors).m_capacity < uVar23)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_optimized_cluster_selectors,uVar23,
                 uVar19 + 1 == uVar23,8,(object_mover)0x0,false);
    }
    (this->m_optimized_cluster_selectors).m_size = uVar23;
  }
  local_50 = this;
  if (uVar23 != 0) {
    uVar16 = 0;
    do {
      lVar25 = 0;
      do {
        bVar22 = 0;
        bVar12 = 0;
        uVar27 = 0;
        do {
          if ((this->m_optimized_cluster_selectors).m_size <= uVar16) goto LAB_00229678;
          if ((pbVar26->m_local_selectors).m_size <= uVar16) {
            pcVar17 = 
            "const T &basisu::vector<basist::selector>::operator[](size_t) const [T = basist::selector]"
            ;
            goto LAB_002296ac;
          }
          if (3 < ((uint)uVar27 | (uint)lVar25)) {
            __assert_fail("(x < 4) && (y < 4)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_transcoder_internal.h"
                          ,0x2f6,"uint32_t basist::selector::get_selector(uint32_t, uint32_t) const"
                         );
          }
          peVar7 = (this->m_optimized_cluster_selectors).m_p;
          lVar10 = uVar16 * 8 - (uVar27 >> 1);
          bVar8 = bVar22 & 4;
          bVar9 = (byte)lVar25;
          bVar3 = (&g_selector_index_to_etc1)
                  [(pbVar26->m_local_selectors).m_p[uVar16].m_selectors[lVar25] >> (bVar12 & 0x1f) &
                   3];
          bVar20 = ~(byte)(1 << (bVar8 | bVar9 & 0x1f));
          *(byte *)((long)peVar7 + lVar10 + 7) =
               (byte)((bVar3 & 1) << (bVar8 | bVar9 & 0x1f)) |
               *(byte *)((long)peVar7 + lVar10 + 7) & bVar20;
          *(byte *)((long)peVar7 + lVar10 + 5) =
               (bVar3 >> 1) << (bVar8 | bVar9 & 0x1f) |
               bVar20 & *(byte *)((long)peVar7 + lVar10 + 5);
          uVar23 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar23;
          bVar12 = bVar12 + 2;
          bVar22 = bVar22 + 4;
          pbVar26 = local_48;
        } while (uVar23 != 4);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->m_optimized_cluster_selectors).m_size);
  }
  uVar23 = this->m_total_blocks;
  uVar19 = (this->m_block_endpoint_clusters_indices).m_size;
  uVar15 = uVar23;
  if (uVar19 != uVar23) {
    if ((uVar19 <= uVar23) && ((this->m_block_endpoint_clusters_indices).m_capacity < uVar23)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_block_endpoint_clusters_indices,uVar23,
                 uVar19 + 1 == uVar23,8,(object_mover)0x0,false);
      uVar15 = this->m_total_blocks;
    }
    (this->m_block_endpoint_clusters_indices).m_size = uVar23;
  }
  uVar23 = (this->m_orig_encoded_blocks).m_size;
  uVar19 = uVar15;
  if (uVar23 != uVar15) {
    if ((uVar23 <= uVar15) && ((this->m_orig_encoded_blocks).m_capacity < uVar15)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_orig_encoded_blocks,uVar15,uVar23 + 1 == uVar15,8,
                 (object_mover)0x0,false);
      uVar19 = this->m_total_blocks;
    }
    (this->m_orig_encoded_blocks).m_size = uVar15;
  }
  pvVar24 = &this->m_block_selector_cluster_index;
  uVar23 = (this->m_block_selector_cluster_index).m_size;
  local_58 = (elemental_vector *)pvVar24;
  if (uVar23 != uVar19) {
    if (uVar23 <= uVar19) {
      if ((this->m_block_selector_cluster_index).m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar24,uVar19,uVar23 + 1 == uVar19,4,(object_mover)0x0,false
                  );
        uVar23 = (this->m_block_selector_cluster_index).m_size;
      }
      memset(pvVar24->m_p + uVar23,0,(ulong)(uVar19 - uVar23) << 2);
    }
    (this->m_block_selector_cluster_index).m_size = uVar19;
  }
  local_68 = (elemental_vector *)&this->m_endpoint_clusters;
  local_40 = (elemental_vector *)&this->m_encoded_blocks;
  uVar11 = 0;
  do {
    local_5c = uVar11;
    debug_printf("init_global_codebooks: pass %u\n");
    uVar23 = this->m_total_blocks;
    if (uVar23 != 0) {
      uVar19 = 0;
      do {
        uVar15 = uVar19 + 0x80;
        if (uVar15 <= uVar23) {
          uVar23 = uVar15;
        }
        this_01 = (this->m_params).m_pJob_pool;
        local_90._8_8_ = 0;
        local_90._M_unused._M_object = operator_new(0x18);
        *(basisu_frontend **)&((basisu_frontend *)local_90._M_unused._0_8_)->m_params = this;
        *(uint *)&(((basisu_frontend *)local_90._M_unused._0_8_)->m_params).m_pSource_blocks =
             uVar19;
        *(uint *)((long)&(((basisu_frontend *)local_90._M_unused._0_8_)->m_params).m_pSource_blocks
                 + 4) = uVar23;
        (((basisu_frontend *)local_90._M_unused._0_8_)->m_params).m_max_endpoint_clusters = local_5c
        ;
        local_78 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:429:35)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:429:35)>
                   ::_M_manager;
        job_pool::add_job(this_01,(function<void_()> *)&local_90);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        uVar23 = local_50->m_total_blocks;
        this = local_50;
        uVar19 = uVar15;
      } while (uVar15 < uVar23);
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    uVar16 = (ulong)(this->m_endpoint_clusters).m_size;
    if (uVar16 != 0) {
      pvVar24 = (vector<unsigned_int> *)local_68->m_p;
      lVar25 = 0;
      do {
        pvVar5 = *(void **)((long)&pvVar24->m_p + lVar25);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar25 = lVar25 + 0x10;
      } while (uVar16 << 4 != lVar25);
      (this->m_endpoint_clusters).m_size = 0;
    }
    this_02 = local_58;
    uVar23 = (pbVar26->m_local_endpoints).m_size;
    if (uVar23 != 0) {
      uVar19 = 0;
      if ((this->m_endpoint_clusters).m_capacity < uVar23) {
        elemental_vector::increase_capacity
                  (local_68,uVar23,uVar23 == 1,0x10,(object_mover)0x0,false);
        uVar19 = (this->m_endpoint_clusters).m_size;
      }
      if (uVar23 - uVar19 != 0) {
        memset((vector<unsigned_int> *)local_68->m_p + uVar19,0,(ulong)(uVar23 - uVar19) << 4);
      }
      (this->m_endpoint_clusters).m_size = uVar23;
    }
    if (this->m_total_blocks == 0) {
      uVar16 = 0;
    }
    else {
      lVar25 = 0;
      uVar27 = 0;
      do {
        if ((this->m_block_endpoint_clusters_indices).m_size <= uVar27) goto LAB_00229722;
        uVar23 = ((this->m_block_endpoint_clusters_indices).m_p)->m_comps[lVar25];
        if ((this->m_endpoint_clusters).m_size <= uVar23) goto LAB_002296ec;
        pvVar24 = (vector<unsigned_int> *)local_68->m_p;
        iVar21 = (int)lVar25;
        local_90._0_4_ = iVar21;
        p_Var14 = (_Any_data *)pvVar24[uVar23].m_p;
        uVar19 = pvVar24[uVar23].m_size;
        uVar16 = (ulong)uVar19;
        if (&local_90 < (_Any_data *)((long)p_Var14 + uVar16 * 4) &&
            (p_Var14 <= &local_90 && p_Var14 != (_Any_data *)0x0)) goto LAB_00229703;
        pvVar24 = pvVar24 + uVar23;
        uVar13 = iVar21;
        if (pvVar24->m_capacity <= uVar19) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar24,uVar19 + 1,true,4,(object_mover)0x0,false);
          p_Var14 = (_Any_data *)pvVar24->m_p;
          uVar16 = (ulong)pvVar24->m_size;
          uVar13 = local_90._0_4_;
        }
        *(undefined4 *)((long)p_Var14 + uVar16 * 4) = uVar13;
        pvVar24->m_size = pvVar24->m_size + 1;
        if ((this->m_endpoint_clusters).m_size <= uVar23) goto LAB_002296ec;
        pvVar24 = (vector<unsigned_int> *)local_68->m_p;
        local_90._0_4_ = iVar21 + 1;
        p_Var14 = (_Any_data *)pvVar24[uVar23].m_p;
        uVar19 = pvVar24[uVar23].m_size;
        uVar16 = (ulong)uVar19;
        if (&local_90 < (_Any_data *)((long)p_Var14 + uVar16 * 4) &&
            (p_Var14 <= &local_90 && p_Var14 != (_Any_data *)0x0)) goto LAB_00229703;
        pvVar24 = pvVar24 + uVar23;
        uVar13 = iVar21 + 1;
        if (pvVar24->m_capacity <= uVar19) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar24,uVar19 + 1,true,4,(object_mover)0x0,false);
          p_Var14 = (_Any_data *)pvVar24->m_p;
          uVar16 = (ulong)pvVar24->m_size;
          uVar13 = local_90._0_4_;
        }
        *(undefined4 *)((long)p_Var14 + uVar16 * 4) = uVar13;
        pvVar24->m_size = pvVar24->m_size + 1;
        uVar27 = uVar27 + 1;
        uVar16 = (ulong)this->m_total_blocks;
        lVar25 = lVar25 + 2;
        this_02 = local_58;
      } while (uVar27 < uVar16);
    }
    uVar23 = (this->m_block_selector_cluster_index).m_size;
    uVar19 = (uint)uVar16;
    if (uVar23 != uVar19) {
      if (uVar23 <= uVar19) {
        if ((this->m_block_selector_cluster_index).m_capacity < uVar19) {
          elemental_vector::increase_capacity
                    (this_02,uVar19,uVar23 + 1 == uVar19,4,(object_mover)0x0,false);
          uVar23 = (this->m_block_selector_cluster_index).m_size;
        }
        memset((this->m_block_selector_cluster_index).m_p + uVar23,0,(ulong)(uVar19 - uVar23) << 2);
        uVar16 = (ulong)this->m_total_blocks;
      }
      (this->m_block_selector_cluster_index).m_size = uVar19;
    }
    if ((int)uVar16 != 0) {
      uVar23 = 0;
      do {
        uVar19 = uVar23 + 0x80;
        local_90._12_4_ = (uint)uVar16;
        if (uVar19 <= (uint)uVar16) {
          local_90._12_4_ = uVar19;
        }
        local_90._8_4_ = uVar23;
        local_78 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:505:35)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:505:35)>
                   ::_M_manager;
        local_90._M_unused._0_8_ = (undefined8)this;
        job_pool::add_job((this->m_params).m_pJob_pool,(function<void_()> *)&local_90);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        uVar16 = (ulong)this->m_total_blocks;
        uVar23 = uVar19;
      } while (uVar19 < this->m_total_blocks);
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    uVar23 = this->m_total_blocks;
    uVar19 = (this->m_encoded_blocks).m_size;
    uVar15 = uVar23;
    if (uVar19 != uVar23) {
      if ((uVar19 <= uVar23) && ((this->m_encoded_blocks).m_capacity < uVar23)) {
        elemental_vector::increase_capacity
                  (local_40,uVar23,uVar19 + 1 == uVar23,8,(object_mover)0x0,false);
        uVar15 = this->m_total_blocks;
      }
      (this->m_encoded_blocks).m_size = uVar23;
    }
    if (uVar15 != 0) {
      lVar25 = 0;
      uVar16 = 0;
      do {
        if ((this->m_block_endpoint_clusters_indices).m_size <= uVar16) goto LAB_00229722;
        if ((this->m_block_selector_cluster_index).m_size <= uVar16) goto LAB_0022973c;
        if ((this->m_encoded_blocks).m_size <= uVar16) goto LAB_00229678;
        uVar23 = (this->m_block_endpoint_clusters_indices).m_p[uVar16].m_comps[0];
        if ((this->m_endpoint_cluster_etc_params).m_size <= uVar23) goto LAB_002296d5;
        uVar19 = (this->m_block_selector_cluster_index).m_p[uVar16];
        peVar7 = (this->m_encoded_blocks).m_p;
        local_38 = lVar25;
        etc_block::set_block_color5_etc1s
                  ((etc_block *)((long)&peVar7->field_0 + lVar25),
                   (this->m_endpoint_cluster_etc_params).m_p[uVar23].m_color_unscaled);
        if ((this->m_endpoint_cluster_etc_params).m_size <= uVar23) goto LAB_002296d5;
        uVar23 = local_70->m_p[uVar23].m_inten_table[0];
        if (7 < uVar23) {
          __assert_fail("t < 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                        ,0xc1,"void basisu::etc_block::set_inten_table(uint32_t, uint32_t)");
        }
        cVar18 = (char)uVar23;
        peVar7[uVar16].field_0.m_bytes[3] =
             (cVar18 << 2 | cVar18 << 5 | peVar7[uVar16].field_0.m_bytes[3] & 2) + 1;
        if ((local_50->m_optimized_cluster_selectors).m_size <= uVar19) goto LAB_00229678;
        *(undefined4 *)((long)&peVar7[uVar16].field_0 + 4) =
             *(undefined4 *)
              ((long)&(local_50->m_optimized_cluster_selectors).m_p[uVar19].field_0 + 4);
        uVar16 = uVar16 + 1;
        lVar25 = local_38 + 8;
        this = local_50;
      } while (uVar16 < local_50->m_total_blocks);
    }
    pbVar26 = local_48;
    uVar11 = local_5c + 1;
  } while (local_5c + 1 != 3);
  this_00 = &this->m_selector_cluster_block_indices;
  uVar23 = (local_48->m_local_selectors).m_size;
  uVar19 = (this->m_selector_cluster_block_indices).m_size;
  uVar15 = uVar19 - uVar23;
  if (uVar15 != 0) {
    if (uVar19 < uVar23 || uVar15 == 0) {
      if ((this->m_selector_cluster_block_indices).m_capacity < uVar23) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar23,uVar19 + 1 == uVar23,0x10,(object_mover)0x0,
                   false);
        uVar19 = (this->m_selector_cluster_block_indices).m_size;
      }
      if (uVar23 - uVar19 != 0) {
        memset(this_00->m_p + uVar19,0,(ulong)(uVar23 - uVar19) << 4);
      }
    }
    else {
      pvVar24 = this_00->m_p;
      lVar25 = 0;
      do {
        pvVar5 = *(void **)((long)&pvVar24[uVar23].m_p + lVar25);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar25 = lVar25 + 0x10;
      } while ((ulong)uVar15 << 4 != lVar25);
    }
    (local_50->m_selector_cluster_block_indices).m_size = uVar23;
    this = local_50;
  }
  local_90._M_unused._M_member_pointer = local_90._M_unused._M_member_pointer & 0xffffffff00000000;
  if ((this->m_etc1_blocks_etc1s).m_size != 0) {
    uVar13 = 0;
    do {
      if ((this->m_block_selector_cluster_index).m_size <= (uint)uVar13) goto LAB_0022973c;
      uVar23 = (this->m_block_selector_cluster_index).m_p[(uint)uVar13];
      if ((this->m_selector_cluster_block_indices).m_size <= uVar23) goto LAB_002296ec;
      pvVar24 = this_00->m_p;
      p_Var14 = (_Any_data *)pvVar24[uVar23].m_p;
      uVar19 = pvVar24[uVar23].m_size;
      uVar16 = (ulong)uVar19;
      if (&local_90 < (_Any_data *)((long)p_Var14 + uVar16 * 4) &&
          (p_Var14 <= &local_90 && p_Var14 != (_Any_data *)0x0)) {
LAB_00229703:
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]");
      }
      pvVar24 = pvVar24 + uVar23;
      if (pvVar24->m_capacity <= uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar24,uVar19 + 1,true,4,(object_mover)0x0,false);
        p_Var14 = (_Any_data *)pvVar24->m_p;
        uVar16 = (ulong)pvVar24->m_size;
        uVar13 = local_90._0_4_;
      }
      *(undefined4 *)((long)p_Var14 + uVar16 * 4) = uVar13;
      pvVar24->m_size = pvVar24->m_size + 1;
      uVar13 = local_90._0_4_ + 1;
      local_90._0_4_ = uVar13;
    } while ((uint)uVar13 < (this->m_etc1_blocks_etc1s).m_size);
  }
  return true;
LAB_00229722:
  pcVar17 = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
  goto LAB_0022968d;
LAB_002296d5:
  pcVar17 = 
  "T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
  ;
  goto LAB_0022968d;
LAB_00229678:
  pcVar17 = "T &basisu::vector<basisu::etc_block>::operator[](size_t) [T = basisu::etc_block]";
  goto LAB_0022968d;
LAB_0022973c:
  pcVar17 = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
  goto LAB_0022968d;
LAB_002296ec:
  pcVar17 = 
  "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
  ;
LAB_0022968d:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,pcVar17);
}

Assistant:

bool basisu_frontend::init_global_codebooks()
	{
		const basist::basisu_lowlevel_etc1s_transcoder* pTranscoder = m_params.m_pGlobal_codebooks;

		const basist::basisu_lowlevel_etc1s_transcoder::endpoint_vec& endpoints = pTranscoder->get_endpoints();
		const basist::basisu_lowlevel_etc1s_transcoder::selector_vec& selectors = pTranscoder->get_selectors();
				
		m_endpoint_cluster_etc_params.resize(endpoints.size());
		for (uint32_t i = 0; i < endpoints.size(); i++)
		{
			m_endpoint_cluster_etc_params[i].m_inten_table[0] = endpoints[i].m_inten5;
			m_endpoint_cluster_etc_params[i].m_inten_table[1] = endpoints[i].m_inten5;

			m_endpoint_cluster_etc_params[i].m_color_unscaled[0].set(endpoints[i].m_color5.r, endpoints[i].m_color5.g, endpoints[i].m_color5.b, 255);
			m_endpoint_cluster_etc_params[i].m_color_used[0] = true;
			m_endpoint_cluster_etc_params[i].m_valid = true;
		}

		m_optimized_cluster_selectors.resize(selectors.size());
		for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
		{
			for (uint32_t y = 0; y < 4; y++)
				for (uint32_t x = 0; x < 4; x++)
					m_optimized_cluster_selectors[i].set_selector(x, y, selectors[i].get_selector(x, y));
		}

		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		m_orig_encoded_blocks.resize(m_total_blocks);

		m_block_selector_cluster_index.resize(m_total_blocks);

#if 0
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{
					const etc_block& blk = m_etc1_blocks_etc1s[block_index];

					const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

					etc_block trial_blk;
					trial_blk.set_block_color5_etc1s(blk.m_color_unscaled[0]);
					trial_blk.set_flip_bit(true);

					uint64_t best_err = UINT64_MAX;
					uint32_t best_index = 0;

					for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
					{
						trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

						const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
						if (cur_err < best_err)
						{
							best_err = cur_err;
							best_index = i;
							if (!cur_err)
								break;
						}

					} // block_index

					m_block_selector_cluster_index[block_index] = best_index;
				}

#ifndef __EMSCRIPTEN__
				});
#endif

		}

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		m_encoded_blocks.resize(m_total_blocks);
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t selector_index = m_block_selector_cluster_index[block_index];

			etc_block& blk = m_encoded_blocks[block_index];

			blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
			blk.set_flip_bit(true);
			blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
		}
#endif

		// HACK HACK
		const uint32_t NUM_PASSES = 3;
		for (uint32_t pass = 0; pass < NUM_PASSES; pass++)
		{
			debug_printf("init_global_codebooks: pass %u\n", pass);

			const uint32_t N = 128;
			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, pass] {
#endif
										
					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const etc_block& blk = pass ? m_encoded_blocks[block_index] : m_etc1_blocks_etc1s[block_index];
						const uint32_t blk_raw_selector_bits = blk.get_raw_selector_bits();

						etc_block trial_blk(blk);
						trial_blk.set_raw_selector_bits(blk_raw_selector_bits);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;
						etc_block best_block(trial_blk);
												
						for (uint32_t i = 0; i < m_endpoint_cluster_etc_params.size(); i++)
						{
							if (m_endpoint_cluster_etc_params[i].m_inten_table[0] > blk.get_inten_table(0))
								continue;

							trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[i].m_color_unscaled[0]);
							trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[i].m_inten_table[0]);

							const color_rgba* pSource_pixels = get_source_pixel_block(block_index).get_ptr();
							uint64_t cur_err;
							if (!pass)
								cur_err = trial_blk.determine_selectors(pSource_pixels, m_params.m_perceptual);
							else
								cur_err = trial_blk.evaluate_etc1_error(pSource_pixels, m_params.m_perceptual);

							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								best_block = trial_blk;

								if (!cur_err)
									break;
							}
						}

						m_block_endpoint_clusters_indices[block_index][0] = best_index;
						m_block_endpoint_clusters_indices[block_index][1] = best_index;

						m_orig_encoded_blocks[block_index] = best_block;

					} // block_index

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_endpoint_clusters.resize(0);
			m_endpoint_clusters.resize(endpoints.size());
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_cluster_index = m_block_endpoint_clusters_indices[block_index][0];
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2);
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2 + 1);
			}

			m_block_selector_cluster_index.resize(m_total_blocks);

			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

						etc_block trial_blk;
						trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_color_unscaled[0]);
						trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_inten_table[0]);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;

						for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
						{
							trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

							const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								if (!cur_err)
									break;
							}

						} // block_index

						m_block_selector_cluster_index[block_index] = best_index;
					}

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_encoded_blocks.resize(m_total_blocks);
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
				const uint32_t selector_index = m_block_selector_cluster_index[block_index];

				etc_block& blk = m_encoded_blocks[block_index];

				blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
				blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
				blk.set_flip_bit(true);
				blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
			}

		} // pass

		m_selector_cluster_block_indices.resize(selectors.size());
		for (uint32_t block_index = 0; block_index < m_etc1_blocks_etc1s.size(); block_index++)
			m_selector_cluster_block_indices[m_block_selector_cluster_index[block_index]].push_back(block_index);
				
		return true;
	}